

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::demote(Literal *__return_storage_ptr__,Literal *this)

{
  double dVar1;
  int64_t iVar2;
  undefined4 uVar3;
  float fVar4;
  undefined4 uVar5;
  
  dVar1 = getf64(this);
  uVar3 = SUB84(dVar1,0);
  uVar5 = (undefined4)((ulong)dVar1 >> 0x20);
  if ((!NAN(dVar1)) && (ABS(dVar1) != INFINITY)) {
    iVar2 = reinterpreti64(this);
    if (iVar2 + 0xb81000001fffffffU < 0xfffffff) {
      fVar4 = 3.4028235e+38;
      goto LAB_009cb2e7;
    }
    if (iVar2 + 0x381000001fffffffU < 0xfffffff) {
      fVar4 = -3.4028235e+38;
      goto LAB_009cb2e7;
    }
    if (dVar1 < -3.4028234663852886e+38) {
      fVar4 = -INFINITY;
      goto LAB_009cb2e7;
    }
    if (3.4028234663852886e+38 < dVar1) {
      fVar4 = INFINITY;
      goto LAB_009cb2e7;
    }
    dVar1 = getf64(this);
    uVar3 = SUB84(dVar1,0);
    uVar5 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  fVar4 = (float)(double)CONCAT44(uVar5,uVar3);
LAB_009cb2e7:
  *(float *)&__return_storage_ptr__->field_0 = fVar4;
  (__return_storage_ptr__->type).id = 4;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::demote() const {
  auto f64 = getf64();
  if (std::isnan(f64)) {
    return Literal(float(f64));
  }
  if (std::isinf(f64)) {
    return Literal(float(f64));
  }
  // when close to the limit, but still truncatable to a valid value, do that
  // see
  // https://github.com/WebAssembly/sexpr-wasm-prototype/blob/2d375e8d502327e814d62a08f22da9d9b6b675dc/src/wasm-interpreter.c#L247
  uint64_t bits = reinterpreti64();
  if (bits > 0x47efffffe0000000ULL && bits < 0x47effffff0000000ULL) {
    return Literal(std::numeric_limits<float>::max());
  }
  if (bits > 0xc7efffffe0000000ULL && bits < 0xc7effffff0000000ULL) {
    return Literal(-std::numeric_limits<float>::max());
  }
  // when we must convert to infinity, do that
  if (f64 < -std::numeric_limits<float>::max()) {
    return Literal(-std::numeric_limits<float>::infinity());
  }
  if (f64 > std::numeric_limits<float>::max()) {
    return Literal(std::numeric_limits<float>::infinity());
  }
  return Literal(float(getf64()));
}